

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall
CGL::Camera::analyze_world_coord(Camera *this,Vector3D *pos_world,double *ns_x,double *ns_y)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  Vector3D pos_camera;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_d8;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_b8;
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_98 [3];
  
  dVar3 = this->vFov;
  dVar2 = tan(this->hFov * 0.017453292519943295 * 0.5);
  dVar3 = tan(dVar3 * 0.017453292519943295 * 0.5);
  Matrix3x3::T(&this->c2w);
  local_d8.field_2.__vec =
       (__m128d)vsubpd_avx(*(undefined1 (*) [16])(pos_world->field_0).field_2.__vec,
                           *(undefined1 (*) [16])(this->pos).field_0.field_2.__vec);
  local_d8.field_0.z = (pos_world->field_0).field_0.z - (this->pos).field_0.field_0.z;
  Matrix3x3::operator*((Matrix3x3 *)&local_98[0].field_0,(Vector3D *)&local_d8.field_0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"position of coord in camera: ",0x1d);
  poVar1 = operator<<((ostream *)&std::cout,(Vector3D *)&local_b8.field_0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_b8.field_0.z;
  auVar6._8_8_ = 0x7fffffffffffffff;
  auVar6._0_8_ = 0x7fffffffffffffff;
  auVar4 = vandpd_avx(auVar4,auVar6);
  dVar5 = 1.0 / auVar4._0_8_;
  local_98[0]._16_8_ = local_b8.field_0.z * dVar5;
  local_98[0]._0_8_ = dVar5 * local_b8.field_0.x;
  local_98[0]._8_8_ = dVar5 * local_b8.field_0.y;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"position of coord on image plane in camera: ",0x2c);
  poVar1 = operator<<((ostream *)&std::cout,(Vector3D *)&local_98[0].field_0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"camera image plane edges x,y: ",0x1e);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  *ns_x = ((double)local_98[0]._0_8_ / dVar2 + 1.0) * 0.5;
  *ns_y = ((double)local_98[0]._8_8_ / dVar3 + 1.0) * 0.5;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"normalized screen space coords: (x,y) = (",0x29);
  poVar1 = std::ostream::_M_insert<double>(*ns_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(*ns_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  return;
}

Assistant:

void Camera::analyze_world_coord(Vector3D& pos_world, double& ns_x, double& ns_y) {
  double hFOV_rads = this->hFov * (PI / 180.0); // x
  double vFOV_rads = this->vFov * (PI / 180.0); // y

  double edge_x = tan(0.5 * hFOV_rads); //
  double edge_y = tan(0.5 * vFOV_rads);

  Vector3D pos_camera = c2w.T() * (pos_world - pos);
  cout << "position of coord in camera: " << pos_camera << endl;

  Vector3D pos_image = pos_camera / abs(pos_camera.z);
  cout << "position of coord on image plane in camera: " << pos_image << endl;

  cout << "camera image plane edges x,y: " << edge_x << ", " << edge_y << endl;

//  double camera_space_x = edge_x * (2 * x - 1);
//  double camera_space_y = edge_y * (2 * y - 1);
  /*
   * (csx / ex) = 2x - 1
   * (csx/ex) + 1 = 2x
   * x = ((csx/ex)+1)/2
   */

  // Normalized Screen Coords
  ns_x = ((pos_image.x / edge_x)+1)/2.0;
  ns_y = ((pos_image.y / edge_y)+1)/2.0;

  cout << "normalized screen space coords: (x,y) = (" << ns_x << ", " << ns_y << ")\n";
}